

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week11-hw.cpp
# Opt level: O1

void print<int>(int *value)

{
  long *plVar1;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*value);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print(const T& value)
{
    if constexpr(IsContainer<T>)
    {
        for(const auto& item : value)
            std::cout << "[" << item << "]";
        std::cout << std::endl;
    }
    else
    {
        std::cout << value << std::endl;
    }
}